

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O1

void __thiscall
ParticleTest_GetSetMomentum_Test<pica::Particle<(pica::Dimension)2>_>::TestBody
          (ParticleTest_GetSetMomentum_Test<pica::Particle<(pica::Dimension)2>_> *this)

{
  FP *val2;
  FP *val2_00;
  FP *pFVar1;
  undefined1 auVar2 [16];
  double dVar3;
  bool bVar4;
  char *pcVar5;
  double dVar6;
  double dVar7;
  PositionType minPosition;
  PositionType maxPosition;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  AssertHelper local_78;
  internal local_70 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined1 local_60 [24];
  double dStack_48;
  double local_40;
  double local_30;
  short local_28;
  
  minPosition.y = -10.0;
  minPosition.x = -10.0;
  maxPosition.y = 10.0;
  maxPosition.x = 10.0;
  BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
            ((Particle *)local_60,(BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *)this,
             minPosition,maxPosition);
  dVar7 = *(double *)(pica::ParticleTypes::types + (long)local_28 * 0x10) * 29979245800.0;
  local_40 = 64316500.0 / dVar7;
  auVar2._8_4_ = SUB84(dVar7,0);
  auVar2._0_8_ = dVar7;
  auVar2._12_4_ = (int)((ulong)dVar7 >> 0x20);
  register0x00001280 = divpd(_DAT_001c94d0,auVar2);
  local_30 = local_40 * local_40 +
             local_60._16_8_ * local_60._16_8_ + local_60._24_8_ * local_60._24_8_ + 1.0;
  if (local_30 < 0.0) {
    local_30 = sqrt(local_30);
  }
  else {
    local_30 = SQRT(local_30);
  }
  local_30 = 1.0 / local_30;
  val2 = &(this->super_ParticleTest<pica::Particle<(pica::Dimension)2>_>).
          super_BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>.super_BaseFixture.
          maxRelativeError;
  (this->super_ParticleTest<pica::Particle<(pica::Dimension)2>_>).
  super_BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>.super_BaseFixture.maxRelativeError
       = 1e-12;
  val2_00 = &(this->super_ParticleTest<pica::Particle<(pica::Dimension)2>_>).
             super_BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>.super_BaseFixture.
             maxAbsoluteError;
  pFVar1 = &(this->super_ParticleTest<pica::Particle<(pica::Dimension)2>_>).
            super_BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>.super_BaseFixture.
            maxAbsoluteError;
  if (64318776.960464895 < *pFVar1 || *pFVar1 == 64318776.960464895) {
    dVar7 = *(double *)(pica::ParticleTypes::types + (long)local_28 * 0x10);
    dVar6 = 541200.0 - (double)local_60._16_8_ * 29979245800.0 * dVar7;
    dVar3 = -5.4363 - dStack_48 * 29979245800.0 * dVar7;
    dVar7 = 64316500.0 - local_40 * 29979245800.0 * dVar7;
    dVar7 = dVar7 * dVar7 + dVar6 * dVar6 + dVar3 * dVar3;
    if (dVar7 < 0.0) {
      local_80.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)sqrt(dVar7);
    }
    else {
      local_80.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)SQRT(dVar7);
    }
    testing::internal::CmpHelperLE<double,double>
              (local_70,"dist(newMomentum, particle.getMomentum())","this->maxAbsoluteError",
               (double *)&local_80,val2_00);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_80);
      if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((local_68.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x88,pcVar5);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if (local_80.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_80.ptr_ + 8))();
        }
        local_80.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    dVar7 = *(double *)(pica::ParticleTypes::types + (long)local_28 * 0x10);
    dVar6 = 541200.0 - (double)local_60._16_8_ * 29979245800.0 * dVar7;
    dVar3 = -5.4363 - dStack_48 * 29979245800.0 * dVar7;
    dVar7 = 64316500.0 - local_40 * 29979245800.0 * dVar7;
    dVar7 = dVar7 * dVar7 + dVar6 * dVar6 + dVar3 * dVar3;
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    local_80.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (dVar7 / 64318776.960464895);
    testing::internal::CmpHelperLE<double,double>
              (local_70,"dist(newMomentum, particle.getMomentum()) / newMomentum.norm()",
               "this->maxRelativeError",(double *)&local_80,val2);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_80);
      if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((local_68.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x88,pcVar5);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if (local_80.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_80.ptr_ + 8))();
        }
        local_80.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  dVar7 = *(double *)(pica::ParticleTypes::types + (long)local_28 * 0x10) * 29979245800.0;
  dVar7 = 4136905069690029.5 / (dVar7 * dVar7) + 1.0;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  if (ABS(dVar7) < *val2_00 || ABS(dVar7) == *val2_00) {
    local_80.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ABS(dVar7 + -1.0 / local_30);
    testing::internal::CmpHelperLE<double,double>
              (local_70,"fabs(expectedGamma - particle.getGamma())","this->maxAbsoluteError",
               (double *)&local_80,val2_00);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_80);
      if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((local_68.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x8a,pcVar5);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if (local_80.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_80.ptr_ + 8))();
        }
        local_80.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  else {
    local_80.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ABS((-1.0 / local_30 + dVar7) / dVar7);
    testing::internal::CmpHelperLE<double,double>
              (local_70,"fabs(expectedGamma - particle.getGamma()) / fabs(expectedGamma)",
               "this->maxRelativeError",(double *)&local_80,val2);
    if (local_70[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_80);
      if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((local_68.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x8a,pcVar5);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      if (local_80.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_80.ptr_ + 8))();
        }
        local_80.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetSetMomentum)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;

    ParticleType particle = this->randomParticle();
    MomentumType newMomentum(54.12e+4, -543.63e-2, 643.165e5);
    particle.setMomentum(newMomentum);
    this->maxRelativeError = 1e-12;
    ASSERT_NEAR_VECTOR(newMomentum, particle.getMomentum());
    GammaType expectedGamma = sqrt((FP)1 + newMomentum.norm2() / sqr(particle.getMass() * Constants<GammaType >::c()));
    ASSERT_NEAR_FP(expectedGamma, particle.getGamma());
}